

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void GameLoop::start(void)

{
  int gameModeChoice;
  
  do {
    std::operator<<((ostream *)&std::cout,
                    "\nWhich game mode do you want to play? \n 1 - Single game \n 2 - Tournament \n"
                   );
    std::istream::operator>>((istream *)&std::cin,&gameModeChoice);
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13c520);
    std::istream::ignore((long)&std::cin,0x200);
  } while (gameModeChoice - 3U < 0xfffffffe);
  if (gameModeChoice == 1) {
    startSingle(false);
  }
  else {
    startTournament();
  }
  return;
}

Assistant:

void GameLoop::start() {
    int gameModeChoice;
    do {
        cout << "\nWhich game mode do you want to play? \n 1 - Single game \n 2 - Tournament \n";
        cin >> gameModeChoice;
        cin.clear();
        cin.ignore(512, '\n');
    } while (gameModeChoice < 1 || gameModeChoice > 2 || isnan(gameModeChoice));

    switch (gameModeChoice) {
        case 1:
            startSingle();
            break;
        case 2:
            startTournament();
            break;
        default:
            startSingle();
            break;
    }
}